

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generators.cpp
# Opt level: O2

void duckdb::TemplatedGenerateSequence<long>
               (Vector *result,idx_t count,SelectionVector *sel,int64_t start,int64_t increment)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  ulong uVar3;
  idx_t i;
  ulong uVar4;
  
  Vector::SetVectorType(result,FLAT_VECTOR);
  pdVar1 = result->data;
  psVar2 = sel->sel_vector;
  for (uVar4 = 0; count != uVar4; uVar4 = uVar4 + 1) {
    uVar3 = uVar4;
    if (psVar2 != (sel_t *)0x0) {
      uVar3 = (ulong)psVar2[uVar4];
    }
    *(ulong *)(pdVar1 + uVar3 * 8) = uVar3 * increment + start;
  }
  return;
}

Assistant:

void TemplatedGenerateSequence(Vector &result, idx_t count, const SelectionVector &sel, int64_t start,
                               int64_t increment) {
	D_ASSERT(result.GetType().IsNumeric());
	if (start > NumericLimits<T>::Maximum() || increment > NumericLimits<T>::Maximum()) {
		throw InternalException("Sequence start or increment out of type range");
	}
	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto result_data = FlatVector::GetData<T>(result);
	auto value = static_cast<uint64_t>(start);
	for (idx_t i = 0; i < count; i++) {
		auto idx = sel.get_index(i);
		result_data[idx] = static_cast<T>(value + static_cast<uint64_t>(increment) * idx);
	}
}